

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFO.cpp
# Opt level: O0

bool __thiscall UFO::logic(UFO *this,int step)

{
  bool bVar1;
  Entity *pEVar2;
  int in_ESI;
  Player *in_RDI;
  float fVar3;
  float fVar4;
  double dVar5;
  LargeSlowBullet *b;
  float shot_angle;
  float py;
  float px;
  Player *p_1;
  ResourceManager *rm;
  int now;
  Player *p;
  undefined8 in_stack_ffffffffffffff88;
  int iVar6;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  Entity *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  Player *this_00;
  bool local_1;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  this_00 = in_RDI;
  pEVar2 = Entity::getPlayerCollision(&in_RDI->super_Entity);
  if (pEVar2 == (Entity *)0x0) {
    dVar5 = (double)al_get_time();
    if (in_RDI->invincibleCount < (int)(dVar5 * 1000.0)) {
      in_RDI->invincibleCount = (int)(dVar5 * 1000.0) + *(int *)&(in_RDI->super_Entity).field_0x34;
      ResourceManager::getInstance();
      pEVar2 = (Entity *)ResourceManager::getData((ResourceManager *)in_RDI,iVar6);
      fVar3 = Entity::getX(pEVar2);
      fVar4 = Entity::getY(pEVar2);
      std::atan2((double)(ulong)(uint)(fVar4 - (in_RDI->super_Entity).y),
                 (double)(ulong)(uint)(fVar3 - (in_RDI->super_Entity).x));
      pEVar2 = (Entity *)operator_new(0x68);
      LargeSlowBullet::LargeSlowBullet
                ((LargeSlowBullet *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),(float)in_stack_ffffffffffffff98,
                 (float)((ulong)in_RDI >> 0x20),pEVar2);
      std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::push_back
                ((list<Entity_*,_std::allocator<Entity_*>_> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),(value_type *)pEVar2)
      ;
      my_play_sample((int)((ulong)in_RDI >> 0x20));
    }
    *(int *)&in_RDI->bitmap = *(int *)&in_RDI->bitmap - in_ESI;
    if (*(int *)&in_RDI->bitmap < 1) {
      *(undefined4 *)&in_RDI->bitmap = *(undefined4 *)&(in_RDI->super_Resource)._vptr_Resource;
      in_RDI->score = in_RDI->score + 1;
      in_RDI->score = in_RDI->score % 3;
    }
    (in_RDI->super_Entity).dx = *(float *)((long)&in_RDI->bitmap + 4) * (float)in_ESI;
    (in_RDI->super_Entity).dy = *(float *)&in_RDI->trans_bitmap * (float)in_ESI;
    Entity::wrap(&in_RDI->super_Entity);
    bVar1 = Entity::logic(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    Entity::explode((Entity *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar6 = (int)((ulong)in_RDI >> 0x20);
    (*pEVar2->_vptr_Entity[4])(pEVar2,1);
    Player::die(this_00);
    my_play_sample(iVar6);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool UFO::logic(int step)
{
   Player *p = (Player *)getPlayerCollision();
   if (p) {
      explode();
      p->hit(1);
      p->die();
      my_play_sample(RES_COLLISION);
      return false;
   }

   int now = (int) (al_get_time() * 1000.0);
   if (now > nextShot) {
      nextShot = now + SHOT_SPEED;
      ResourceManager& rm = ResourceManager::getInstance();
      Player *p = (Player *)rm.getData(RES_PLAYER);
      float px = p->getX();
      float py = p->getY();
      float shot_angle = atan2(py-y, px-x);
      LargeSlowBullet *b = new LargeSlowBullet(x, y, shot_angle, this);
      new_entities.push_back(b);
      my_play_sample(RES_FIRELARGE);
   }

   bitmapFrameCount -= step;
   if (bitmapFrameCount <= 0) {
      bitmapFrameCount = ANIMATION_SPEED;
      bitmapFrame++;
      bitmapFrame %= 3; // loop
   }
   
   dx = speed_x * step;
   dy = speed_y * step;

   Entity::wrap();

   if (!Entity::logic(step))
      return false;

   return true;
}